

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O2

void R_InitVoxels(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint i;
  char *pcVar8;
  ulong uVar9;
  int j;
  FVoxel *this;
  ulong extraout_XMM0_Qb;
  FVoxelDef *def;
  TArray<unsigned_int,_unsigned_int> vsprites;
  double local_158;
  int lastlump;
  double local_148;
  ulong uStack_140;
  FScanner sc;
  
  lastlump = 0;
LAB_004ff051:
  iVar4 = FWadCollection::FindLump(&Wads,"VOXELDEF",&lastlump,false);
  if (iVar4 == -1) {
    return;
  }
  FScanner::FScanner(&sc,iVar4);
  vsprites.Array = (uint *)0x0;
  vsprites.Most = 0;
  vsprites.Count = 0;
LAB_004ff088:
  TArray<unsigned_int,_unsigned_int>::Clear(&vsprites);
LAB_004ff095:
  do {
    bVar1 = FScanner::GetString(&sc);
    pcVar8 = sc.String;
    if (!bVar1) break;
    if (*sc.String == '=') {
      pcVar8 = "No sprites specified for voxel.\n";
      if (vsprites.Count != 0) goto LAB_004ff18b;
      goto LAB_004ff178;
    }
    if ((sc.StringLen & 0xfffffffeU) == 4) {
      uVar6 = 0xff000000;
      if (sc.StringLen == 5) {
        iVar4 = toupper((int)sc.String[4]);
        pcVar8[4] = (char)iVar4;
        if ((byte)(sc.String[4] + 0xa2U) < 0xe3) {
          FScanner::ScriptMessage(&sc,"Sprite frame %c is invalid.\n");
          goto LAB_004ff095;
        }
        if (sc.StringLen != 4) {
          uVar6 = sc.String[4] * 0x1000000 + 0xbf000000;
        }
      }
      uVar5 = GetSpriteIndex(sc.String,false);
      if (uVar5 != 0xffffffff) {
        def = (FVoxelDef *)CONCAT44(def._4_4_,uVar5 | uVar6);
        TArray<unsigned_int,_unsigned_int>::Push(&vsprites,(uint *)&def);
      }
      goto LAB_004ff095;
    }
    FScanner::ScriptMessage(&sc,"Sprite name \"%s\" is wrong size.\n",sc.String);
  } while( true );
  pcVar8 = "Unexpected end of file\n";
  if (vsprites.Count != 0) {
LAB_004ff178:
    FScanner::ScriptMessage(&sc,pcVar8);
    if (!bVar1) goto LAB_004ff592;
LAB_004ff18b:
    FScanner::SetCMode(&sc,true);
    FScanner::MustGetToken(&sc,0x102);
    iVar4 = FWadCollection::CheckNumForFullName(&Wads,sc.String,true,0xb);
    pcVar8 = "Voxel \"%s\" not found.\n";
    if (iVar4 < 0) {
LAB_004ff223:
      FScanner::ScriptMessage(&sc,pcVar8,sc.String);
      this = (FVoxel *)0x0;
    }
    else {
      uVar9 = 0;
      do {
        if (Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count == uVar9) {
          def = (FVoxelDef *)R_LoadKVX(iVar4);
          if ((FVoxel *)def == (FVoxel *)0x0) {
            pcVar8 = "\"%s\" is not a valid voxel file.\n";
            goto LAB_004ff223;
          }
          TArray<FVoxel_*,_FVoxel_*>::Push(&Voxels.super_TArray<FVoxel_*,_FVoxel_*>,(FVoxel **)&def)
          ;
          pcVar8 = "\"%s\" is not a valid voxel file.\n";
          this = (FVoxel *)def;
          if (def == (FVoxelDef *)0x0) goto LAB_004ff223;
          break;
        }
        this = Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Array[uVar9];
        uVar9 = uVar9 + 1;
      } while (this->LumpNum != iVar4);
    }
    bVar1 = FScanner::CheckToken(&sc,0x7b);
    bVar3 = false;
    local_148 = 90.0;
    uStack_140 = 0;
    local_158 = 1.0;
    iVar7 = 0;
    iVar4 = 0;
    if (bVar1) {
      local_148 = 90.0;
      uStack_140 = 0;
      local_158 = 1.0;
      iVar4 = 0;
      iVar7 = 0;
      bVar1 = false;
      while (bVar3 = bVar1, bVar1 = FScanner::GetToken(&sc), bVar1) {
        if (sc.TokenType == 0x7d) goto LAB_004ff4cc;
        FScanner::TokenMustBe(&sc,0x101);
        bVar2 = FScanner::Compare(&sc,"scale");
        bVar1 = bVar3;
        if (bVar2) {
          FScanner::MustGetToken(&sc,0x3d);
          FScanner::MustGetToken(&sc,0x106);
          local_158 = sc.Float;
        }
        else {
          bVar2 = FScanner::Compare(&sc,"spin");
          if (bVar2) {
            FScanner::MustGetToken(&sc,0x3d);
            bVar3 = FScanner::CheckToken(&sc,0x2d);
            FScanner::MustGetToken(&sc,0x104);
            iVar4 = -sc.Number;
            iVar7 = -sc.Number;
            if (!bVar3) {
              iVar4 = sc.Number;
              iVar7 = sc.Number;
            }
          }
          else {
            bVar2 = FScanner::Compare(&sc,"placedspin");
            if (bVar2) {
              FScanner::MustGetToken(&sc,0x3d);
              bVar3 = FScanner::CheckToken(&sc,0x2d);
              FScanner::MustGetToken(&sc,0x104);
              iVar7 = -sc.Number;
              if (!bVar3) {
                iVar7 = sc.Number;
              }
            }
            else {
              bVar2 = FScanner::Compare(&sc,"droppedspin");
              if (bVar2) {
                FScanner::MustGetToken(&sc,0x3d);
                bVar3 = FScanner::CheckToken(&sc,0x2d);
                FScanner::MustGetToken(&sc,0x104);
                iVar4 = -sc.Number;
                if (!bVar3) {
                  iVar4 = sc.Number;
                }
              }
              else {
                bVar2 = FScanner::Compare(&sc,"angleoffset");
                if (bVar2) {
                  FScanner::MustGetToken(&sc,0x3d);
                  bVar3 = FScanner::CheckToken(&sc,0x2d);
                  FScanner::MustGetAnyToken(&sc);
                  if (sc.TokenType == 0x104) {
                    sc.Float = (double)sc.Number;
                    uStack_140 = extraout_XMM0_Qb;
                  }
                  else {
                    FScanner::TokenMustBe(&sc,0x106);
                    uStack_140 = 0;
                  }
                  local_148 = sc.Float;
                  if (bVar3) {
                    local_148 = -sc.Float;
                    uStack_140 = uStack_140 ^ 0x8000000000000000;
                  }
                  local_148 = local_148 + 90.0;
                }
                else {
                  bVar2 = FScanner::Compare(&sc,"overridepalette");
                  bVar1 = true;
                  if (!bVar2) {
                    FScanner::ScriptMessage(&sc,"Unknown voxel option \'%s\'\n",sc.String);
                    bVar2 = FScanner::CheckToken(&sc,0x3d);
                    bVar1 = bVar3;
                    if (bVar2) {
                      FScanner::MustGetAnyToken(&sc);
                    }
                  }
                }
              }
            }
          }
        }
      }
      FScanner::ScriptMessage(&sc,"Unterminated voxel option block\n");
    }
LAB_004ff4cc:
    FScanner::SetCMode(&sc,false);
    if ((this != (FVoxel *)0x0) && (vsprites.Count != 0)) {
      if (bVar3) {
        FVoxel::RemovePalette(this);
      }
      def = (FVoxelDef *)operator_new(0x28);
      def->Voxel = this;
      def->Scale = local_158;
      def->DroppedSpin = iVar4;
      def->PlacedSpin = iVar7;
      (def->AngleOffset).Degrees = local_148;
      TArray<FVoxelDef_*,_FVoxelDef_*>::Push(&VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>,&def)
      ;
      for (uVar9 = 0; uVar9 < (ulong)vsprites._8_8_ >> 0x20; uVar9 = uVar9 + 1) {
        uVar5 = vsprites.Array[uVar9] & 0xffffff;
        uVar6 = vsprites.Array[uVar9] >> 0x18;
        if (uVar6 == 0xff) {
          for (iVar4 = 0x1c; -1 < iVar4; iVar4 = iVar4 + -1) {
            VOX_AddVoxel(uVar5,iVar4,def);
          }
        }
        else {
          VOX_AddVoxel(uVar5,uVar6,def);
        }
      }
    }
    goto LAB_004ff088;
  }
LAB_004ff592:
  TArray<unsigned_int,_unsigned_int>::~TArray(&vsprites);
  FScanner::~FScanner(&sc);
  goto LAB_004ff051;
}

Assistant:

void R_InitVoxels()
{
	int lump, lastlump = 0;
	
	while ((lump = Wads.FindLump("VOXELDEF", &lastlump)) != -1)
	{
		FScanner sc(lump);
		TArray<DWORD> vsprites;

		while (VOX_ReadSpriteNames(sc, vsprites))
		{
			FVoxel *voxeldata = NULL;
			int voxelfile;
			VoxelOptions opts;

			sc.SetCMode(true);
			sc.MustGetToken(TK_StringConst);
			voxelfile = Wads.CheckNumForFullName(sc.String, true, ns_voxels);
			if (voxelfile < 0)
			{
				sc.ScriptMessage("Voxel \"%s\" not found.\n", sc.String);
			}
			else
			{
				voxeldata = VOX_GetVoxel(voxelfile);
				if (voxeldata == NULL)
				{
					sc.ScriptMessage("\"%s\" is not a valid voxel file.\n", sc.String);
				}
			}
			if (sc.CheckToken('{'))
			{
				VOX_ReadOptions(sc, opts);
			}
			sc.SetCMode(false);
			if (voxeldata != NULL && vsprites.Size() != 0)
			{
				if (opts.OverridePalette)
				{
					voxeldata->RemovePalette();
				}
				FVoxelDef *def = new FVoxelDef;

				def->Voxel = voxeldata;
				def->Scale = opts.Scale;
				def->DroppedSpin = opts.DroppedSpin;
				def->PlacedSpin = opts.PlacedSpin;
				def->AngleOffset = opts.AngleOffset;
				VoxelDefs.Push(def);

				for (unsigned i = 0; i < vsprites.Size(); ++i)
				{
					int sprnum = int(vsprites[i] & 0xFFFFFF);
					int frame = int(vsprites[i] >> 24);
					if (frame == 255)
					{ // Apply voxel to all frames.
						for (int j = MAX_SPRITE_FRAMES - 1; j >= 0; --j)
						{
							VOX_AddVoxel(sprnum, j, def);
						}
					}
					else
					{ // Apply voxel to only one frame.
						VOX_AddVoxel(sprnum, frame, def);
					}
				}
			}
		}
	}
}